

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void __thiscall
wasm::Visitor<wasm::ReFinalizeNode,_void>::visit
          (Visitor<wasm::ReFinalizeNode,_void> *this,Expression *curr)

{
  if (curr != (Expression *)0x0) {
    switch(curr->_id) {
    case BlockId:
      ::wasm::Block::finalize();
      return;
    case IfId:
      ::wasm::If::finalize();
      return;
    case LoopId:
      ::wasm::Loop::finalize();
      return;
    case BreakId:
      ::wasm::Break::finalize();
      return;
    case SwitchId:
      ::wasm::Switch::finalize();
      return;
    case CallId:
      ::wasm::Call::finalize();
      return;
    case CallIndirectId:
      ::wasm::CallIndirect::finalize();
      return;
    case LocalGetId:
    case GlobalGetId:
    case ReturnId:
    case NopId:
    case UnreachableId:
    case PopId:
      return;
    case LocalSetId:
      ::wasm::LocalSet::finalize();
      return;
    case GlobalSetId:
      ::wasm::GlobalSet::finalize();
      return;
    case LoadId:
      ::wasm::Load::finalize();
      return;
    case StoreId:
      ::wasm::Store::finalize();
      return;
    case ConstId:
      ::wasm::Const::finalize();
      return;
    case UnaryId:
      ::wasm::Unary::finalize();
      return;
    case BinaryId:
      ::wasm::Binary::finalize();
      return;
    case SelectId:
      ::wasm::Select::finalize();
      return;
    case DropId:
      ::wasm::Drop::finalize();
      return;
    case MemorySizeId:
      ::wasm::MemorySize::finalize();
      return;
    case MemoryGrowId:
      ::wasm::MemoryGrow::finalize();
      return;
    case AtomicRMWId:
      ::wasm::AtomicRMW::finalize();
      return;
    case AtomicCmpxchgId:
      ::wasm::AtomicCmpxchg::finalize();
      return;
    case AtomicWaitId:
      ::wasm::AtomicWait::finalize();
      return;
    case AtomicNotifyId:
      ::wasm::AtomicNotify::finalize();
      return;
    case AtomicFenceId:
      ::wasm::AtomicFence::finalize();
      return;
    case SIMDExtractId:
      ::wasm::SIMDExtract::finalize();
      return;
    case SIMDReplaceId:
      ::wasm::SIMDReplace::finalize();
      return;
    case SIMDShuffleId:
      ::wasm::SIMDShuffle::finalize();
      return;
    case SIMDTernaryId:
      ::wasm::SIMDTernary::finalize();
      return;
    case SIMDShiftId:
      ::wasm::SIMDShift::finalize();
      return;
    case SIMDLoadId:
      ::wasm::SIMDLoad::finalize();
      return;
    case SIMDLoadStoreLaneId:
      ::wasm::SIMDLoadStoreLane::finalize();
      return;
    case MemoryInitId:
      ::wasm::MemoryInit::finalize();
      return;
    case DataDropId:
      ::wasm::DataDrop::finalize();
      return;
    case MemoryCopyId:
      ::wasm::MemoryCopy::finalize();
      return;
    case MemoryFillId:
      ::wasm::MemoryFill::finalize();
      return;
    case RefNullId:
      ::wasm::RefNull::finalize();
      return;
    case RefIsNullId:
      ::wasm::RefIsNull::finalize();
      return;
    case RefFuncId:
      ::wasm::RefFunc::finalize();
      return;
    case RefEqId:
      ::wasm::RefEq::finalize();
      return;
    case TableGetId:
      ::wasm::TableGet::finalize();
      return;
    case TableSetId:
      ::wasm::TableSet::finalize();
      return;
    case TableSizeId:
      ::wasm::TableSize::finalize();
      return;
    case TableGrowId:
      ::wasm::TableGrow::finalize();
      return;
    case TryId:
      ::wasm::Try::finalize();
      return;
    case ThrowId:
      ::wasm::Throw::finalize();
      return;
    case RethrowId:
      ::wasm::Rethrow::finalize();
      return;
    case TupleMakeId:
      ::wasm::TupleMake::finalize();
      return;
    case TupleExtractId:
      ::wasm::TupleExtract::finalize();
      return;
    case I31NewId:
      ::wasm::I31New::finalize();
      return;
    case I31GetId:
      ::wasm::I31Get::finalize();
      return;
    case CallRefId:
      ::wasm::CallRef::finalize();
      return;
    case RefTestId:
      ::wasm::RefTest::finalize();
      return;
    case RefCastId:
      ::wasm::RefCast::finalize();
      return;
    case BrOnId:
      ::wasm::BrOn::finalize();
      return;
    case StructNewId:
      ::wasm::StructNew::finalize();
      return;
    case StructGetId:
      ::wasm::StructGet::finalize();
      return;
    case StructSetId:
      ::wasm::StructSet::finalize();
      return;
    case ArrayNewId:
      ::wasm::ArrayNew::finalize();
      return;
    case ArrayNewSegId:
      ::wasm::ArrayNewSeg::finalize();
      return;
    case ArrayNewFixedId:
      ::wasm::ArrayNewFixed::finalize();
      return;
    case ArrayGetId:
      ::wasm::ArrayGet::finalize();
      return;
    case ArraySetId:
      ::wasm::ArraySet::finalize();
      return;
    case ArrayLenId:
      ::wasm::ArrayLen::finalize();
      return;
    case ArrayCopyId:
      ::wasm::ArrayCopy::finalize();
      return;
    case ArrayFillId:
      ::wasm::ArrayFill::finalize();
      return;
    case ArrayInitId:
      ::wasm::ArrayInit::finalize();
      return;
    case RefAsId:
      ::wasm::RefAs::finalize();
      return;
    case StringNewId:
      ::wasm::StringNew::finalize();
      return;
    case StringConstId:
      ::wasm::StringConst::finalize();
      return;
    case StringMeasureId:
      ::wasm::StringMeasure::finalize();
      return;
    case StringEncodeId:
      ::wasm::StringEncode::finalize();
      return;
    case StringConcatId:
      ::wasm::StringConcat::finalize();
      return;
    case StringEqId:
      ::wasm::StringEq::finalize();
      return;
    case StringAsId:
      ::wasm::StringAs::finalize();
      return;
    case StringWTF8AdvanceId:
      ::wasm::StringWTF8Advance::finalize();
      return;
    case StringWTF16GetId:
      ::wasm::StringWTF16Get::finalize();
      return;
    case StringIterNextId:
      ::wasm::StringIterNext::finalize();
      return;
    case StringIterMoveId:
      ::wasm::StringIterMove::finalize();
      return;
    case StringSliceWTFId:
      ::wasm::StringSliceWTF::finalize();
      return;
    case StringSliceIterId:
      ::wasm::StringSliceIter::finalize();
      return;
    default:
      ::wasm::handle_unreachable
                ("unexpected expression type",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-traversal.h"
                 ,0x45);
    }
  }
  __assert_fail("curr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-traversal.h"
                ,0x3a,
                "ReturnType wasm::Visitor<wasm::ReFinalizeNode>::visit(Expression *) [SubType = wasm::ReFinalizeNode, ReturnType = void]"
               );
}

Assistant:

ReturnType visit(Expression* curr) {
    assert(curr);

    switch (curr->_id) {
#define DELEGATE(CLASS_TO_VISIT)                                               \
  case Expression::Id::CLASS_TO_VISIT##Id:                                     \
    return static_cast<SubType*>(this)->visit##CLASS_TO_VISIT(                 \
      static_cast<CLASS_TO_VISIT*>(curr))

#include "wasm-delegations.def"

      default:
        WASM_UNREACHABLE("unexpected expression type");
    }
  }